

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *in_RDI;
  bool bVar3;
  char_t *end_1;
  char_t *end;
  char_t ss;
  char_t *begin;
  gap g;
  char_t *in_stack_ffffffffffffffc0;
  gap *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar4;
  gap local_20;
  byte *local_10;
  
  local_10 = in_RDI;
  gap::gap(&local_20);
  pbVar1 = local_10;
  do {
    while (bVar4 = *local_10, ((anonymous_namespace)::chartype_table[bVar4] & 1) != 0) {
LAB_00edd9bd:
      if (*local_10 == 0x3c) {
        pbVar2 = (byte *)gap::flush(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        while( true ) {
          bVar3 = false;
          if (pbVar1 < pbVar2) {
            bVar3 = ((anonymous_namespace)::chartype_table[pbVar2[-1]] & 8) != 0;
          }
          if (!bVar3) break;
          pbVar2 = pbVar2 + -1;
        }
        *pbVar2 = 0;
        return (char_t *)(local_10 + 1);
      }
      if (*local_10 == 0xd) {
        pbVar2 = local_10 + 1;
        *local_10 = 10;
        local_10 = pbVar2;
        if (*pbVar2 == 10) {
          gap::push((gap *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),&in_stack_ffffffffffffffc8->end
                    ,(size_t)in_stack_ffffffffffffffc0);
        }
      }
      else {
        if (*local_10 == 0) {
          pbVar2 = (byte *)gap::flush(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
          while( true ) {
            bVar3 = false;
            if (pbVar1 < pbVar2) {
              bVar3 = ((anonymous_namespace)::chartype_table[pbVar2[-1]] & 8) != 0;
            }
            if (!bVar3) break;
            pbVar2 = pbVar2 + -1;
          }
          *pbVar2 = 0;
          return (char_t *)local_10;
        }
        local_10 = local_10 + 1;
      }
    }
    bVar4 = local_10[1];
    if (((anonymous_namespace)::chartype_table[bVar4] & 1) != 0) {
      local_10 = local_10 + 1;
      goto LAB_00edd9bd;
    }
    bVar4 = local_10[2];
    if (((anonymous_namespace)::chartype_table[bVar4] & 1) != 0) {
      local_10 = local_10 + 2;
      goto LAB_00edd9bd;
    }
    bVar4 = local_10[3];
    if (((anonymous_namespace)::chartype_table[bVar4] & 1) != 0) {
      local_10 = local_10 + 3;
      goto LAB_00edd9bd;
    }
    local_10 = local_10 + 4;
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}